

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void train(Ptr<cv::face::FacemarkLBF> *facemark)

{
  element_type *peVar1;
  long lVar2;
  ulong uVar3;
  allocator local_211;
  Ptr<cv::face::FacemarkLBF> *local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  images_train;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  landmarks_train;
  undefined4 local_1c8 [2];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *local_1c0;
  undefined8 local_1b8;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> facial_points;
  string local_190 [32];
  string local_170 [32];
  String ptsFiles;
  String imageFiles;
  undefined1 local_110 [16];
  uchar *local_100;
  Mat image;
  string local_50 [32];
  
  local_210 = facemark;
  std::__cxx11::string::string
            ((string *)&imageFiles,"../dlib_faces_5points/images_train.txt",(allocator *)&image);
  std::__cxx11::string::string
            ((string *)&ptsFiles,"../dlib_faces_5points/points_train.txt",(allocator *)&image);
  images_train.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  images_train.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  images_train.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  landmarks_train.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  landmarks_train.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  landmarks_train.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string(local_170,(string *)&imageFiles);
  std::__cxx11::string::string(local_190,(string *)&ptsFiles);
  cv::face::loadDatasetList(local_170,local_190,&images_train,&landmarks_train);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_170);
  cv::Mat::Mat(&image);
  facial_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  facial_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  facial_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar2 = 0;
  uVar3 = 0;
  while( true ) {
    if ((ulong)((long)images_train.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)images_train.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar3) break;
    std::__cxx11::string::string
              ((string *)local_1c8,
               *(char **)((long)&((images_train.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar2),&local_211);
    cv::imread((string *)local_110,(int)(string *)local_1c8);
    cv::Mat::operator=(&image,(Mat *)local_110);
    cv::Mat::~Mat((Mat *)local_110);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::string
              (local_50,(string *)
                        ((long)&((landmarks_train.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        lVar2));
    local_100 = (uchar *)0x0;
    local_110._0_4_ = -0x7dfcfff3;
    local_110._8_8_ = &facial_points;
    cv::face::loadFacePoints(0,local_50,(Mat *)local_110);
    std::__cxx11::string::~string(local_50);
    peVar1 = (local_210->super_shared_ptr<cv::face::FacemarkLBF>).
             super___shared_ptr<cv::face::FacemarkLBF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_100 = (uchar *)0x0;
    local_110._0_4_ = 0x1010000;
    local_1b8 = 0;
    local_110._8_8_ = &image;
    local_1c8[0] = 0x8103000d;
    local_1c0 = &facial_points;
    (**(code **)(*(long *)peVar1 + 0x50))(peVar1,(Mat *)local_110,(string *)local_1c8);
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x20;
  }
  peVar1 = (local_210->super_shared_ptr<cv::face::FacemarkLBF>).
           super___shared_ptr<cv::face::FacemarkLBF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(code **)(*(long *)peVar1 + 0x58))(peVar1,0);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&facial_points.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
  cv::Mat::~Mat(&image);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&landmarks_train);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&images_train);
  std::__cxx11::string::~string((string *)&ptsFiles);
  std::__cxx11::string::~string((string *)&imageFiles);
  return;
}

Assistant:

void train(Ptr<FacemarkLBF> facemark)
{
    // load the dataset list
    String imageFiles = "../dlib_faces_5points/images_train.txt";
    String ptsFiles = "../dlib_faces_5points/points_train.txt";
    vector<String> images_train;
    vector<String> landmarks_train;
    loadDatasetList(imageFiles,ptsFiles,images_train,landmarks_train);

    // add the training samples to the trainer
    Mat image;
    vector<Point2f> facial_points;
    for(size_t i=0;i<images_train.size();i++){
        image = imread(images_train[i].c_str());
        loadFacePoints(landmarks_train[i],facial_points);
        facemark->addTrainingSample(image, facial_points);
    }

    // training process
    facemark->training();
}